

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_print_integer.c
# Opt level: O2

void intformat(intmax_t value,_PDCLIB_status_t *status)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  ulong uVar10;
  ulong uVar11;
  long lStack_40;
  uint uStack_38;
  char preface [3];
  undefined1 uStack_31;
  ulong uVar9;
  
  uStack_38 = (uint)in_RAX;
  uVar3 = uStack_38;
  uStack_31 = (undefined1)((ulong)in_RAX >> 0x38);
  _uStack_38 = (uint7)uStack_38;
  uVar9 = _uStack_38;
  if (status->prec < 0) {
    status->prec = 1;
  }
  uVar2 = status->flags;
  if ((uVar2 & 4) == 0) {
LAB_00104426:
    lStack_40 = 0;
LAB_0010446d:
    if (-1 < value) goto LAB_00104472;
    preface[lStack_40] = '-';
  }
  else {
    if (status->base != 0x10) {
      if (value == 0 || status->base != 8) goto LAB_00104426;
      _uStack_38 = CONCAT14(0x30,uVar3);
      lStack_40 = 1;
      goto LAB_0010446d;
    }
    if (value != 0) {
      _uStack_38 = CONCAT14(0x30,uVar3);
      stack0xffffffffffffffce = SUB82(uVar9,6);
      _uStack_38 = CONCAT26(stack0xffffffffffffffce,
                            CONCAT15(((byte)(uVar2 >> 0x10) & 1) << 5,_uStack_38)) | 0x580000000000;
      lStack_40 = 2;
      goto LAB_0010446d;
    }
    lStack_40 = 0;
LAB_00104472:
    if ((uVar2 >> 0x11 & 1) != 0) goto LAB_00104496;
    if ((uVar2 & 2) == 0) {
      if ((uVar2 & 8) == 0) goto LAB_00104496;
      preface[lStack_40] = ' ';
    }
    else {
      preface[lStack_40] = '+';
    }
  }
  lStack_40 = lStack_40 + 1;
LAB_00104496:
  uVar10 = (ulong)status->prec;
  uVar9 = status->current;
  uVar11 = uVar9;
  if ((uVar2 & 0x11) == 0) {
    uVar5 = uVar10;
    if (uVar10 < uVar9) {
      uVar5 = uVar9;
    }
    uVar4 = status->width;
    if (uVar5 + lStack_40 < uVar4) {
      for (uVar7 = 0; uVar7 < uVar4 - (uVar5 + lStack_40); uVar7 = uVar7 + 1) {
        if (status->i < status->n) {
          if ((FILE *)status->stream == (FILE *)0x0) {
            status->s[status->i] = ' ';
          }
          else {
            putc(0x20,(FILE *)status->stream);
          }
        }
        uVar11 = status->current + 1;
        status->i = status->i + 1;
        status->current = uVar11;
        uVar4 = status->width;
      }
    }
  }
  pcVar6 = preface;
  while( true ) {
    cVar1 = *pcVar6;
    if (cVar1 == '\0') break;
    if (status->i < status->n) {
      if ((FILE *)status->stream == (FILE *)0x0) {
        status->s[status->i] = cVar1;
      }
      else {
        putc((int)cVar1,(FILE *)status->stream);
      }
    }
    uVar11 = status->current + 1;
    status->i = status->i + 1;
    status->current = uVar11;
    pcVar6 = pcVar6 + 1;
  }
  if (uVar10 <= uVar9) {
    uVar9 = uVar10;
  }
  for (lVar8 = uVar9 - uVar10; lVar8 != 0; lVar8 = lVar8 + 1) {
    if (status->i < status->n) {
      if ((FILE *)status->stream == (FILE *)0x0) {
        status->s[status->i] = '0';
      }
      else {
        putc(0x30,(FILE *)status->stream);
      }
    }
    uVar11 = status->current + 1;
    status->i = status->i + 1;
    status->current = uVar11;
  }
  if ((status->flags & 0x11U) == 0x10) {
    while (uVar11 < status->width) {
      if (status->i < status->n) {
        if ((FILE *)status->stream == (FILE *)0x0) {
          status->s[status->i] = '0';
        }
        else {
          putc(0x30,(FILE *)status->stream);
        }
      }
      uVar11 = status->current + 1;
      status->i = status->i + 1;
      status->current = uVar11;
    }
  }
  return;
}

Assistant:

static void intformat( intmax_t value, struct _PDCLIB_status_t * status )
{
    /* At worst, we need two prefix characters (hex prefix). */
    char preface[3] = "\0";
    size_t preidx = 0;

    if ( status->prec < 0 )
    {
        status->prec = 1;
    }

    if ( ( status->flags & E_alt ) && ( status->base == 16 || status->base == 8 ) && ( value != 0 ) )
    {
        /* Octal / hexadecimal prefix for "%#" conversions */
        preface[ preidx++ ] = '0';

        if ( status->base == 16 )
        {
            preface[ preidx++ ] = ( status->flags & E_lower ) ? 'x' : 'X';
        }
    }

    if ( value < 0 )
    {
        /* Negative sign for negative values - at all times. */
        preface[ preidx++ ] = '-';
    }
    else if ( !( status->flags & E_unsigned ) )
    {
        /* plus sign / extra space are only for signed conversions */
        if ( status->flags & E_plus )
        {
            preface[ preidx++ ] = '+';
        }
        else
        {
            if ( status->flags & E_space )
            {
                preface[ preidx++ ] = ' ';
            }
        }
    }

    {
        /* At this point, status->current has the number of digits queued up.
           Determine if we have a precision requirement to pad those.
        */
        size_t prec_pads = ( ( _PDCLIB_size_t )status->prec > status->current ) ? ( ( _PDCLIB_size_t )status->prec - status->current ) : 0;

        if ( !( status->flags & ( E_minus | E_zero ) ) )
        {
            /* Space padding is only done if no zero padding or left alignment
               is requested. Calculate the number of characters that WILL be
               printed, including any prefixes determined above.
            */
            /* The number of characters to be printed, plus prefixes if any. */
            /* This line contained probably the most stupid, time-wasting bug
               I've ever perpetrated. Greetings to Samface, DevL, and all
               sceners at Breakpoint 2006.
            */
            size_t characters = preidx + ( ( status->current > ( _PDCLIB_size_t )status->prec ) ? status->current : ( _PDCLIB_size_t )status->prec );

            if ( status->width > characters )
            {
                size_t i;

                for ( i = 0; i < status->width - characters; ++i )
                {
                    PUT( ' ' );
                    ++( status->current );
                }
            }
        }

        /* Now we did the padding, do the prefixes (if any). */
        preidx = 0;

        while ( preface[ preidx ] != '\0' )
        {
            PUT( preface[ preidx++ ] );
            ++( status->current );
        }

        /* Do the precision padding if necessary. */
        while ( prec_pads-- > 0 )
        {
            PUT( '0' );
            ++( status->current );
        }

        if ( ( !( status->flags & E_minus ) ) && ( status->flags & E_zero ) )
        {
            /* If field is not left aligned, and zero padding is requested, do
               so.
            */
            while ( status->current < status->width )
            {
                PUT( '0' );
                ++( status->current );
            }
        }
    }
}